

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>::
appendCopy(OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_void>
           *this,KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *elem)

{
  undefined8 *in_RDI;
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>_>
  *this_00;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *in_stack_ffffffffffffffd8;
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>_>
  local_18 [3];
  
  this_00 = local_18;
  std::
  make_unique<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>>
            (in_stack_ffffffffffffffd8);
  (**(code **)*in_RDI)(in_RDI,this_00);
  std::
  unique_ptr<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_std::default_delete<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

void appendCopy(T elem) {
        append(std::make_unique<T>(std::move(elem)));
    }